

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::UniformAccessLogger::assign1i
          (UniformAccessLogger *this,string *name,int x)

{
  ostringstream *this_00;
  int iVar1;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  iVar1 = getLocation(this,name);
  local_1a8._0_8_ = this->m_log;
  this_00 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"// Assigning to uniform ",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,": ",2);
  std::ostream::operator<<(this_00,x);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_130);
  (*this->m_gl->uniform1i)(iVar1,x);
  return;
}

Assistant:

void UniformAccessLogger::assign1i (const string& name, int x)
{
	const int loc = getLocation(name);
	m_log << TestLog::Message << "// Assigning to uniform " << name << ": " << x << TestLog::EndMessage;
	m_gl.uniform1i(loc, x);
}